

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall olc::Sprite::SaveToPGESprFile(Sprite *this,string *sImageFile)

{
  byte bVar1;
  bool bVar2;
  string local_220 [8];
  ofstream ofs;
  string *sImageFile_local;
  Sprite *this_local;
  
  if (this->pColData == (Pixel *)0x0) {
    this_local._4_4_ = FAIL;
  }
  else {
    std::ofstream::ofstream(local_220);
    std::ofstream::open(local_220,(_Ios_Openmode)sImageFile);
    bVar1 = std::ofstream::is_open();
    bVar2 = (bVar1 & 1) != 0;
    if (bVar2) {
      std::ostream::write((char *)local_220,(long)this);
      std::ostream::write((char *)local_220,(long)&this->height);
      std::ostream::write((char *)local_220,(long)this->pColData);
      std::ofstream::close();
    }
    this_local._4_4_ = (rcode)bVar2;
    std::ofstream::~ofstream(local_220);
  }
  return this_local._4_4_;
}

Assistant:

olc::rcode Sprite::SaveToPGESprFile(const std::string &sImageFile)
	{
		if (pColData == nullptr)
			return olc::FAIL;

		std::ofstream ofs;
		ofs.open(sImageFile, std::ifstream::binary);
		if (ofs.is_open())
		{
			ofs.write((char *)&width, sizeof(int32_t));
			ofs.write((char *)&height, sizeof(int32_t));
			ofs.write((char *)pColData, (size_t)width * (size_t)height * sizeof(uint32_t));
			ofs.close();
			return olc::OK;
		}

		return olc::FAIL;
	}